

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_ssl_client.cpp
# Opt level: O0

size_t __thiscall
bidfx_public_api::tools::OpenSSLClient::InputStreamImpl::ReadBytes
          (InputStreamImpl *this,uchar *buf,size_t len)

{
  int iVar1;
  element_type *this_00;
  size_t bytes;
  size_t len_local;
  uchar *buf_local;
  InputStreamImpl *this_local;
  
  iVar1 = SSL_read((SSL *)this->open_ssl_client_->ssl_,buf,(int)len);
  if ((long)iVar1 == 0xffffffffffffffff) {
    this_00 = std::__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<spdlog::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)Log);
    spdlog::logger::info<>(this_00,"Could not read bytes");
  }
  return (long)iVar1;
}

Assistant:

size_t OpenSSLClient::InputStreamImpl::ReadBytes(unsigned char *buf, size_t len)
{
    size_t bytes = SSL_read(open_ssl_client_->ssl_, buf, len);
    if (bytes == -1)
    {
        Log->info("Could not read bytes");
    }
    return bytes;
}